

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::
make_next_inequality_node(branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  reference pvVar6;
  value_type *pvVar7;
  reference pvVar8;
  int local_38;
  float local_34;
  reference local_30;
  node *node_1;
  uint variables;
  int sumfactor;
  float sumr;
  uint level;
  node *node_0;
  branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this_local;
  
  node_0 = (node *)this;
  _sumr = std::
          vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
          ::back(&this->nodes);
  uVar4 = _sumr->level + 1;
  sumfactor = uVar4;
  sVar5 = shared_subvector::element_size(&this->subvector);
  if (uVar4 < sVar5) {
    _sumr->level = sumfactor;
    _sumr->z = _sumr->sumr;
    uVar4 = sumfactor + 1;
    sVar5 = shared_subvector::element_size(&this->subvector);
    if (uVar4 < sVar5) {
      pvVar6 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
               ::operator[](&this->items,(ulong)(sumfactor + 1));
      _sumr->z = pvVar6->sum_z + _sumr->z;
    }
    fVar1 = _sumr->sumr;
    node_1._4_4_ = _sumr->sumfactor;
    node_1._0_4_ = _sumr->variables;
    variables = (uint)fVar1;
    pvVar6 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[](&this->items,(ulong)(uint)sumfactor);
    iVar2 = node_1._4_4_;
    local_34 = fVar1 + pvVar6->r;
    pvVar6 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[](&this->items,(ulong)(uint)sumfactor);
    local_38 = iVar2 + pvVar6->factor;
    local_30 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node>>
               ::emplace_back<float,int,unsigned_int_const&>
                         ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node>>
                           *)&this->nodes,&local_34,&local_38,(uint *)&sumfactor);
    sVar5 = shared_subvector::emplace(&this->subvector);
    local_30->variables = sVar5;
    shared_subvector::copy
              (&this->subvector,(EVP_PKEY_CTX *)(ulong)(uint)node_1,
               (EVP_PKEY_CTX *)(ulong)local_30->variables);
    pvVar7 = shared_subvector::operator[](&this->subvector,local_30->variables + sumfactor);
    *pvVar7 = '\x01';
    uVar4 = sumfactor + 1;
    sVar5 = shared_subvector::element_size(&this->subvector);
    if (uVar4 < sVar5) {
      fVar1 = local_30->sumr;
      pvVar6 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
               ::operator[](&this->items,(ulong)(sumfactor + 1));
      local_30->z = fVar1 + pvVar6->sum_z;
    }
    if ((local_30->sumfactor < this->b_min) || (this->b_max < local_30->sumfactor)) {
      if (this->b_max < local_30->sumfactor) {
        shared_subvector::remove(&this->subvector,(char *)(ulong)local_30->variables);
        std::
        vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
        ::pop_back(&this->nodes);
      }
    }
    else {
      bVar3 = is_best_solution(this,local_30->sumr);
      if (bVar3) {
        shared_subvector::copy
                  (&this->subvector,(EVP_PKEY_CTX *)(ulong)(uint)node_1,
                   (EVP_PKEY_CTX *)(ulong)this->solution);
        shared_subvector::invert(&this->subvector,this->solution,sumfactor);
        pvVar8 = std::
                 vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
                 ::back(&this->nodes);
        this->lower_bound = pvVar8->sumr;
      }
    }
  }
  else {
    shared_subvector::remove(&this->subvector,(char *)(ulong)_sumr->variables);
    std::
    vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
    ::pop_back(&this->nodes);
  }
  return;
}

Assistant:

void make_next_inequality_node()
    {
        node& node_0 = nodes.back();

        const unsigned level = node_0.level + 1;
        if (level >= subvector.element_size()) {
            subvector.remove(node_0.variables);
            nodes.pop_back();
            return;
        }

        node_0.level = level;
        node_0.z = node_0.sumr;

        if (level + 1 < subvector.element_size())
            node_0.z += items[level + 1].sum_z;

        const Float sumr = node_0.sumr;
        const int sumfactor = node_0.sumfactor;
        const unsigned int variables = node_0.variables;

        node& node_1 = nodes.emplace_back(
          sumr + items[level].r, sumfactor + items[level].factor, level);
        node_1.variables = subvector.emplace();
        subvector.copy(variables, node_1.variables);
        subvector[node_1.variables + level] = 1;
        if (level + 1 < subvector.element_size())
            node_1.z = node_1.sumr + items[level + 1].sum_z;

        if (b_min <= node_1.sumfactor && node_1.sumfactor <= b_max) {
            if (is_best_solution(node_1.sumr)) {
                subvector.copy(variables, solution);
                subvector.invert(solution, level);
                lower_bound = nodes.back().sumr;
            }
        } else if (node_1.sumfactor > b_max) {
            subvector.remove(node_1.variables);
            nodes.pop_back();
        }
    }